

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O2

void anurbs::NurbsCurveGeometry<3L>::save(Model *model,Type *data,Json *target)

{
  int iVar1;
  undefined4 extraout_var;
  DataWriter writer;
  allocator<char> local_99;
  DataWriter local_98;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_90;
  string local_68;
  Ref<const_Eigen::Matrix<double,__1,_3,_1,__1,_3>,_0,_Eigen::OuterStride<_1>_> local_48;
  
  local_98.m_data = target;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"degree",&local_99);
  iVar1 = (*(data->super_CurveBase<3L>)._vptr_CurveBase[2])(data);
  local_68._M_dataplus._M_p = (pointer)CONCAT44(extraout_var,iVar1);
  DataWriter::write<long>(&local_98,(string *)&local_90,(long *)&local_68);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"nb_poles",&local_99);
  local_68._M_dataplus._M_p =
       (pointer)(data->m_poles).super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_1,__1,_3>_>.
                m_storage.m_rows;
  DataWriter::write<long>(&local_98,(string *)&local_90,(long *)&local_68);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"knots",&local_99);
  knots(&local_90,data);
  DataWriter::
  write_vector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
            (&local_98,&local_68,&local_90);
  free(local_90.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"poles",(allocator<char> *)&local_68);
  poles(&local_48,data);
  DataWriter::
  write_matrix<Eigen::Ref<Eigen::Matrix<double,_1,3,1,_1,3>const,0,Eigen::OuterStride<_1>>>
            (&local_98,(string *)&local_90,&local_48);
  free(local_48.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_3,_1,__1,_3>_>.m_storage.
       m_data);
  std::__cxx11::string::~string((string *)&local_90);
  if ((data->m_weights).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
      m_rows != 0) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"weights",&local_99);
    weights(&local_90,data);
    DataWriter::
    write_vector<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
              (&local_98,&local_68,&local_90);
    free(local_90.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
         m_data);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

static void save(const Model& model, const Type& data, Json& target)
    {
        DataWriter writer(target);

        writer.write("degree", data.degree());
        writer.write("nb_poles", data.nb_poles());
        writer.write_vector("knots", data.knots());
        writer.write_matrix("poles", data.poles());

        if (data.is_rational()) {
            writer.write_vector("weights", data.weights());
        }
    }